

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprintf.c
# Opt level: O2

int dprintf_formatf(void *data,_func_int_int_FILE_ptr *stream,char *format,__va_list_tag *ap_save)

{
  double dVar1;
  char cVar2;
  undefined8 __nptr;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  char *pcVar7;
  size_t sVar8;
  char *pcVar9;
  uint uVar10;
  anon_union_8_4_dbbb708a_for_data *paVar11;
  char **ppcVar12;
  byte *buffer;
  char *pcVar13;
  ulong uVar14;
  ulong uVar15;
  anon_union_8_4_dbbb708a_for_data *paVar16;
  uint *puVar17;
  anon_union_8_4_dbbb708a_for_data aVar18;
  int *piVar19;
  byte bVar20;
  long lVar21;
  char *pcVar22;
  int iVar23;
  size_t maxlength;
  ulong uVar24;
  uint uVar25;
  bool bVar26;
  bool bVar27;
  ulong uStack_1610;
  long local_1600;
  long local_15e0;
  char *local_15d8;
  char *local_15c8;
  char **local_15c0;
  char formatbuf [32];
  char work [326];
  va_stack_t vto [128];
  char *endpos [128];
  
  work._0_8_ = format;
  ppcVar12 = endpos;
  iVar23 = 0;
  local_15d8 = (char *)0x0;
LAB_001024ea:
  pcVar7 = (char *)(work._0_8_ + 1);
  do {
    pcVar22 = pcVar7;
    if (pcVar22[-1] == '\0') {
      pcVar7 = (char *)0;
      if (0 < (long)local_15d8) {
        pcVar7 = local_15d8;
      }
      paVar11 = &vto[0].data;
      goto LAB_00102a25;
    }
    if (pcVar22[-1] != '%') {
      work._0_8_ = pcVar22;
      goto LAB_001024ea;
    }
    pcVar7 = pcVar22 + 2;
  } while (*pcVar22 == '%');
  iVar23 = iVar23 + 1;
  local_15c0 = ppcVar12;
  work._0_8_ = pcVar22;
  lVar5 = dprintf_DollarString(pcVar22,(char **)work);
  lVar21 = (long)iVar23;
  if (lVar5 != 0) {
    lVar21 = lVar5;
  }
  if ((long)local_15d8 < lVar21) {
    local_15d8 = (char *)lVar21;
  }
  lVar5 = 0;
  local_1600 = 0;
  uVar25 = 0;
  do {
    __nptr = work._0_8_;
    bVar20 = *(byte *)work._0_8_;
    uVar10 = bVar20 - 0x20;
    if (((0x2f < uVar10) || ((0x900003ff6c09U >> ((ulong)uVar10 & 0x3f) & 1) == 0)) &&
       ((0x12 < bVar20 - 0x68 || ((0x40211U >> (bVar20 - 0x68 & 0x1f) & 1) == 0))))
    goto LAB_00102750;
    work._0_8_ = work._0_8_ + 1;
    switch((ulong)uVar10) {
    case 0:
      uVar25 = uVar25 | 1;
    case 1:
    case 2:
    case 4:
    case 5:
    case 6:
    case 7:
    case 8:
    case 9:
    case 0xc:
    case 0xf:
      break;
    case 3:
      uVar25 = uVar25 | 8;
      break;
    case 10:
      uVar25 = uVar25 | 0x4000;
      iVar23 = iVar23 + 1;
      lVar6 = dprintf_DollarString((char *)work._0_8_,(char **)work);
      lVar5 = (long)iVar23;
      if (lVar6 != 0) {
        lVar5 = lVar6;
      }
      if ((long)local_15d8 < lVar5) {
        local_15d8 = (char *)lVar5;
      }
      break;
    case 0xb:
      uVar25 = uVar25 | 2;
      break;
    case 0xd:
      uVar25 = uVar25 & 0xfffffefb | 4;
      break;
    case 0xe:
      if (*(char *)work._0_8_ == '*') {
        uVar25 = uVar25 | 0x10000;
        work._0_8_ = __nptr + 2;
        iVar23 = iVar23 + 1;
        lVar6 = dprintf_DollarString((char *)work._0_8_,(char **)work);
        local_1600 = (long)iVar23;
        if (lVar6 != 0) {
          local_1600 = lVar6;
        }
        if ((long)local_15d8 < local_1600) {
          local_15d8 = (char *)local_1600;
        }
      }
      else {
        uVar25 = uVar25 | 0x8000;
        local_1600 = strtol((char *)work._0_8_,(char **)work,10);
      }
      break;
    case 0x10:
      uVar25 = uVar25 | (~uVar25 & 4) << 6;
    case 0x11:
    case 0x12:
    case 0x13:
    case 0x14:
    case 0x15:
    case 0x16:
    case 0x17:
    case 0x18:
    case 0x19:
      uVar25 = uVar25 | 0x2000;
      lVar5 = strtol((char *)__nptr,(char **)work,10);
      break;
    default:
      if (bVar20 != 0x4c) {
        if (bVar20 != 0x4f) {
          if (bVar20 == 0x68) {
            uVar25 = uVar25 | 0x10;
            break;
          }
          if (bVar20 == 0x6c) {
            if ((uVar25 & 0x20) != 0) goto LAB_0010270b;
          }
          else {
            if (bVar20 == 0x71) {
LAB_0010270b:
              uVar25 = uVar25 | 0x40;
              break;
            }
            if (bVar20 != 0x7a) break;
          }
        }
        uVar25 = uVar25 | 0x20;
        break;
      }
      uVar25 = uVar25 | 0x80;
    }
  } while( true );
LAB_00102a25:
  bVar26 = pcVar7 == (char *)0x0;
  pcVar7 = (char *)((long)pcVar7 + -1);
  if (bVar26) goto LAB_00102bb0;
  uVar25 = *(int *)((long)paVar11 + -0x14);
  if ((uVar25 >> 0xe & 1) != 0) {
    uVar10 = ap_save->gp_offset;
    if ((ulong)uVar10 < 0x29) {
      piVar19 = (int *)((ulong)uVar10 + (long)ap_save->reg_save_area);
      ap_save->gp_offset = uVar10 + 8;
    }
    else {
      piVar19 = (int *)ap_save->overflow_arg_area;
      ap_save->overflow_arg_area = piVar19 + 2;
    }
    vto[*(long *)(paVar11 + -2)].data = (anon_union_8_4_dbbb708a_for_data)(long)*piVar19;
  }
  if ((uVar25 >> 0x10 & 1) != 0) {
    uVar10 = ap_save->gp_offset;
    if ((ulong)uVar10 < 0x29) {
      piVar19 = (int *)((ulong)uVar10 + (long)ap_save->reg_save_area);
      ap_save->gp_offset = uVar10 + 8;
    }
    else {
      piVar19 = (int *)ap_save->overflow_arg_area;
      ap_save->overflow_arg_area = piVar19 + 2;
    }
    vto[*(long *)(paVar11 + -1)].data = (anon_union_8_4_dbbb708a_for_data)(long)*piVar19;
  }
  switch(((va_stack_t *)(paVar11 + -3))->type) {
  case FORMAT_UNKNOWN:
  case FORMAT_STRING:
  case FORMAT_PTR:
  case FORMAT_INTPTR:
switchD_00102ac4_caseD_0:
    uVar24 = (ulong)ap_save->gp_offset;
    if (uVar24 < 0x29) {
LAB_00102ad2:
      paVar16 = (anon_union_8_4_dbbb708a_for_data *)(uVar24 + (long)ap_save->reg_save_area);
      ap_save->gp_offset = (int)uVar24 + 8;
    }
    else {
LAB_00102b61:
      paVar16 = (anon_union_8_4_dbbb708a_for_data *)ap_save->overflow_arg_area;
      ap_save->overflow_arg_area = paVar16 + 1;
    }
    aVar18 = *paVar16;
    goto LAB_00102b70;
  case FORMAT_INT:
    if ((((~uVar25 & 0x240) == 0) || ((uVar25 & 0x40) != 0)) || ((~uVar25 & 0x220) == 0))
    goto switchD_00102ac4_caseD_0;
    uVar10 = ap_save->gp_offset;
    uVar24 = (ulong)uVar10;
    if ((uVar25 & 0x20) != 0) {
      if (0x28 < uVar10) goto LAB_00102b61;
      goto LAB_00102ad2;
    }
    if ((uVar25 >> 9 & 1) == 0) {
      if (uVar10 < 0x29) {
        piVar19 = (int *)(uVar24 + (long)ap_save->reg_save_area);
        ap_save->gp_offset = uVar10 + 8;
      }
      else {
        piVar19 = (int *)ap_save->overflow_arg_area;
        ap_save->overflow_arg_area = piVar19 + 2;
      }
      aVar18 = (anon_union_8_4_dbbb708a_for_data)(long)*piVar19;
    }
    else {
      if (uVar10 < 0x29) {
        puVar17 = (uint *)(uVar24 + (long)ap_save->reg_save_area);
        ap_save->gp_offset = uVar10 + 8;
      }
      else {
        puVar17 = (uint *)ap_save->overflow_arg_area;
        ap_save->overflow_arg_area = puVar17 + 2;
      }
      aVar18._4_4_ = 0;
      aVar18._0_4_ = *puVar17;
    }
LAB_00102b70:
    *paVar11 = aVar18;
    break;
  case FORMAT_DOUBLE:
    uVar25 = ap_save->fp_offset;
    if ((ulong)uVar25 < 0xa1) {
      paVar16 = (anon_union_8_4_dbbb708a_for_data *)((ulong)uVar25 + (long)ap_save->reg_save_area);
      ap_save->fp_offset = uVar25 + 0x10;
    }
    else {
      paVar16 = (anon_union_8_4_dbbb708a_for_data *)ap_save->overflow_arg_area;
      ap_save->overflow_arg_area = paVar16 + 1;
    }
    *paVar11 = *paVar16;
    break;
  case FORMAT_WIDTH:
    ((va_stack_t *)(paVar11 + -3))->type = FORMAT_INT;
  }
  paVar11 = paVar11 + 4;
  goto LAB_00102a25;
LAB_00102bb0:
  ppcVar12 = endpos;
  local_15e0 = 0;
  iVar23 = 0;
  local_15d8 = "0123456789abcdefghijklmnopqrstuvwxyz";
  pcVar7 = format;
  do {
    while( true ) {
      while (local_15c8 = pcVar7, cVar2 = *format, cVar2 != '%') {
        if (cVar2 == '\0') {
          return iVar23;
        }
        do {
          iVar3 = (*stream)((int)cVar2,(FILE *)data);
          if (iVar3 == -1) {
            return iVar23;
          }
          iVar23 = iVar23 + 1;
          cVar2 = format[1];
          format = format + 1;
          pcVar7 = format;
        } while ((cVar2 != '\0') && (pcVar7 = format, cVar2 != '%'));
      }
      local_15c8 = format + 1;
      if (format[1] != '%') break;
      format = format + 2;
      local_15c8 = format;
      iVar3 = (*stream)(0x25,(FILE *)data);
      if (iVar3 == -1) {
        return iVar23;
      }
      iVar23 = iVar23 + 1;
      pcVar7 = local_15c8;
    }
    lVar5 = dprintf_DollarString(local_15c8,&local_15c8);
    lVar21 = lVar5 + -1;
    if (lVar5 == 0) {
      lVar21 = local_15e0;
    }
    uVar25 = vto[lVar21].flags;
    uVar24 = (ulong)uVar25;
    if ((uVar25 >> 0xe & 1) == 0) {
      local_15e0 = local_15e0 + 1;
      pcVar7 = (char *)vto[lVar21].width;
      pcVar22 = pcVar7;
    }
    else {
      pcVar22 = (char *)vto[lVar21].width;
      pcVar7 = vto[(long)pcVar22].data.str;
      local_15e0 = local_15e0 + 2;
      if ((long)pcVar7 < 0) {
        pcVar7 = (char *)-(long)pcVar7;
        uVar25 = uVar25 & 0xfffffefb | 4;
        uVar24 = (ulong)uVar25;
        vto[lVar21].flags = uVar25;
      }
    }
    uVar25 = (uint)uVar24;
    if ((uVar25 >> 0x10 & 1) == 0) {
      if ((short)uVar24 < 0) {
        pcVar13 = (char *)vto[lVar21].precision;
      }
      else {
        pcVar13 = (char *)0xffffffffffffffff;
      }
    }
    else {
      local_15e0 = local_15e0 + 1;
      pcVar13 = vto[vto[lVar21].precision].data.str;
      if ((long)vto[vto[lVar21].precision].data.str < 0) {
        pcVar13 = (char *)0xffffffffffffffff;
      }
    }
    switch(vto[lVar21].type) {
    case FORMAT_STRING:
      pcVar22 = vto[lVar21].data.str;
      if (pcVar22 == (char *)0x0) {
        if (pcVar13 == (char *)0xffffffffffffffff || 4 < (long)pcVar13) {
          uVar24 = (ulong)(uVar25 & 0xfffffff7);
          vto[lVar21].flags = uVar25 & 0xfffffff7;
          pcVar22 = "(nil)";
          pcVar13 = (char *)0x5;
        }
        else {
          pcVar22 = "";
          pcVar13 = (char *)0x0;
        }
      }
      else if (pcVar13 == (char *)0xffffffffffffffff) {
        pcVar13 = (char *)strlen(pcVar22);
      }
      pcVar9 = (char *)0x7fffffffffffffff;
      if (pcVar13 < (char *)0x7fffffffffffffff) {
        pcVar9 = pcVar13;
      }
      if ((uVar24 & 8) != 0) {
        iVar3 = (*stream)(0x22,(FILE *)data);
        if (iVar3 == -1) {
          return iVar23;
        }
        iVar23 = iVar23 + 1;
        uVar24 = (ulong)(uint)vto[lVar21].flags;
      }
      uVar14 = (long)pcVar7 - (long)pcVar9;
      uVar15 = uVar14;
      if ((uVar24 & 4) == 0) {
        uVar15 = ((long)uVar14 >> 0x3f & uVar14) - 1;
        for (; 0 < (long)uVar14; uVar14 = uVar14 - 1) {
          iVar3 = (*stream)(0x20,(FILE *)data);
          if (iVar3 == -1) {
            return iVar23;
          }
          iVar23 = iVar23 + 1;
        }
      }
      for (pcVar7 = (char *)0x0; iVar3 = (int)pcVar13, pcVar13 != pcVar7; pcVar7 = pcVar7 + 1) {
        iVar3 = (int)pcVar7;
        if (pcVar22[(long)pcVar7] == '\0') break;
        iVar4 = (*stream)((int)pcVar22[(long)pcVar7],(FILE *)data);
        if (iVar4 == -1) {
          return iVar23 + iVar3;
        }
      }
      iVar23 = iVar3 + iVar23;
      uVar25 = vto[lVar21].flags;
      if ((uVar25 & 4) != 0) {
        for (; 0 < (long)uVar15; uVar15 = uVar15 - 1) {
          iVar3 = (*stream)(0x20,(FILE *)data);
          if (iVar3 == -1) {
            return iVar23;
          }
          iVar23 = iVar23 + 1;
        }
        uVar25 = vto[lVar21].flags;
      }
      if ((uVar25 & 8) != 0) {
        iVar3 = (*stream)(0x22,(FILE *)data);
        if (iVar3 == -1) {
          return iVar23;
        }
        iVar23 = iVar23 + 1;
      }
      break;
    case FORMAT_PTR:
      pcVar22 = vto[lVar21].data.str;
      if (pcVar22 != (char *)0x0) {
        local_15d8 = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ";
        if ((uVar25 >> 0xc & 1) == 0) {
          local_15d8 = "0123456789abcdefghijklmnopqrstuvwxyz";
        }
        uVar10 = 1;
LAB_00102e01:
        bVar26 = false;
        bVar20 = 1;
        uStack_1610 = 0x10;
        pcVar9 = pcVar22;
        goto LAB_001030d3;
      }
      pcVar7 = pcVar7 + -5;
      pcVar22 = pcVar7;
      if ((uVar24 & 4) != 0) {
        uVar24 = (long)pcVar7 >> 0x3f & (ulong)pcVar7;
        for (; pcVar22 = (char *)(uVar24 - 1), 0 < (long)pcVar7; pcVar7 = pcVar7 + -1) {
          iVar3 = (*stream)(0x20,(FILE *)data);
          if (iVar3 == -1) {
            return iVar23;
          }
          iVar23 = iVar23 + 1;
        }
      }
      iVar3 = iVar23 + 5;
      for (lVar5 = 0; lVar5 != 5; lVar5 = lVar5 + 1) {
        iVar4 = (*stream)((int)"(nil)"[lVar5],(FILE *)data);
        if (iVar4 == -1) {
          return iVar23 + (int)lVar5;
        }
      }
      iVar23 = iVar3;
      if ((vto[lVar21].flags & 4) == 0) {
        for (; iVar23 = iVar3, 0 < (long)pcVar22; pcVar22 = pcVar22 + -1) {
          iVar23 = (*stream)(0x20,(FILE *)data);
          if (iVar23 == -1) {
            return iVar3;
          }
          iVar3 = iVar3 + 1;
        }
      }
      break;
    case FORMAT_INT:
      pcVar22 = vto[lVar21].data.str;
      if ((uVar25 >> 0x11 & 1) == 0) {
        uVar10 = (uint)(uVar24 >> 3) & 1;
        pcVar9 = pcVar22;
        if ((uVar25 >> 10 & 1) == 0) {
          if ((uVar25 >> 0xb & 1) != 0) {
            local_15d8 = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ";
            if ((uVar25 >> 0xc & 1) == 0) {
              local_15d8 = "0123456789abcdefghijklmnopqrstuvwxyz";
            }
            goto LAB_00102e01;
          }
          if ((uVar25 >> 9 & 1) != 0) {
            bVar26 = false;
            bVar20 = 0;
            uStack_1610 = 10;
            goto LAB_001030d3;
          }
          pcVar9 = (char *)-(long)pcVar22;
          if (0 < (long)pcVar22) {
            pcVar9 = pcVar22;
          }
          bVar27 = -1 < (long)pcVar22;
          bVar26 = false;
          bVar20 = 0;
          uStack_1610 = 10;
        }
        else {
          bVar20 = 0;
          bVar26 = true;
          uStack_1610 = 8;
LAB_001030d3:
          bVar27 = true;
        }
        lVar5 = 0;
        for (; pcVar9 != (char *)0x0; pcVar9 = (char *)((ulong)pcVar9 / uStack_1610)) {
          work[lVar5 + 0x144] = local_15d8[(ulong)pcVar9 % uStack_1610];
          lVar5 = lVar5 + -1;
        }
        if (pcVar13 == (char *)0xffffffffffffffff) {
          pcVar13 = (char *)0x1;
        }
        pcVar13 = pcVar13 + lVar5;
        if ((bVar26 && uVar10 != 0) && ((long)pcVar13 < 1)) {
          work[lVar5 + 0x144] = '0';
          pcVar7 = pcVar7 + lVar5 + -1;
          lVar5 = lVar5 + 0x143;
        }
        else {
          pcVar7 = pcVar7 + lVar5;
          lVar5 = lVar5 + 0x144;
          pcVar22 = pcVar13;
          if (0 < (long)pcVar13) {
            for (; 0 < (long)pcVar22; pcVar22 = pcVar22 + -1) {
              work[lVar5] = '0';
              lVar5 = lVar5 + -1;
            }
            pcVar7 = pcVar7 + -(long)pcVar13;
          }
        }
        bVar20 = (byte)uVar10 & bVar20;
        local_15c0 = (char **)CONCAT44(local_15c0._4_4_,(uint)bVar20);
        pcVar22 = pcVar7 + -2;
        if (bVar20 == 0) {
          pcVar22 = pcVar7;
        }
        uVar14 = (long)pcVar22 - (ulong)(byte)(bVar27 ^ 1U | (uVar24 & 3) != 0);
        uVar15 = uVar14;
        if ((uVar24 & 0x104) == 0) {
          uVar24 = (long)uVar14 >> 0x3f & uVar14;
          for (; uVar15 = uVar24 - 1, 0 < (long)uVar14; uVar14 = uVar14 - 1) {
            iVar3 = (*stream)(0x20,(FILE *)data);
            if (iVar3 == -1) {
              return iVar23;
            }
            iVar23 = iVar23 + 1;
          }
        }
        if (bVar27 == false) {
          uStack_1610._0_4_ = 0x2d;
LAB_00103225:
          iVar3 = (*stream)((int)uStack_1610,(FILE *)data);
          if (iVar3 == -1) {
            return iVar23;
          }
          iVar23 = iVar23 + 1;
        }
        else {
          if ((vto[lVar21].flags & 2U) != 0) {
            uStack_1610._0_4_ = 0x2b;
            goto LAB_00103225;
          }
          if ((vto[lVar21].flags & 1U) != 0) {
            uStack_1610._0_4_ = 0x20;
            goto LAB_00103225;
          }
        }
        if ((char)local_15c0 != '\0') {
          iVar3 = (*stream)(0x30,(FILE *)data);
          if (iVar3 == -1) {
            return iVar23;
          }
          if ((vto[lVar21].flags & 0x1000) == 0) {
            uStack_1610._0_4_ = 0x78;
          }
          else {
            uStack_1610._0_4_ = 0x58;
          }
          iVar3 = (*stream)((int)uStack_1610,(FILE *)data);
          if (iVar3 == -1) {
            return iVar23 + 1;
          }
          iVar23 = iVar23 + 2;
        }
        uVar24 = uVar15;
        if ((vto[lVar21].flags & 0x104U) == 0x100) {
          uVar24 = ((long)uVar15 >> 0x3f & uVar15) - 1;
          for (; 0 < (long)uVar15; uVar15 = uVar15 - 1) {
            iVar3 = (*stream)(0x30,(FILE *)data);
            if (iVar3 == -1) {
              return iVar23;
            }
            iVar23 = iVar23 + 1;
          }
        }
        for (; lVar5 < 0x144; lVar5 = lVar5 + 1) {
          iVar3 = (*stream)((int)work[lVar5 + 1],(FILE *)data);
          if (iVar3 == -1) {
            return iVar23;
          }
          iVar23 = iVar23 + 1;
        }
        if ((vto[lVar21].flags & 4) != 0) {
          for (; 0 < (long)uVar24; uVar24 = uVar24 - 1) {
            iVar3 = (*stream)(0x20,(FILE *)data);
            if (iVar3 == -1) {
              return iVar23;
            }
            iVar23 = iVar23 + 1;
          }
        }
      }
      else {
        if ((uVar24 & 4) == 0) {
          for (; 1 < (long)pcVar7; pcVar7 = pcVar7 + -1) {
            iVar3 = (*stream)(0x20,(FILE *)data);
            if (iVar3 == -1) {
              return iVar23;
            }
            iVar23 = iVar23 + 1;
          }
          pcVar7 = pcVar7 + -1;
        }
        iVar3 = (*stream)((uint)pcVar22 & 0xff,(FILE *)data);
        if (iVar3 == -1) {
          return iVar23;
        }
        iVar23 = iVar23 + 1;
        if ((vto[lVar21].flags & 4) != 0) {
          for (; 1 < (long)pcVar7; pcVar7 = pcVar7 + -1) {
            iVar3 = (*stream)(0x20,(FILE *)data);
            if (iVar3 == -1) {
              return iVar23;
            }
            iVar23 = iVar23 + 1;
          }
        }
      }
      break;
    case FORMAT_INTPTR:
      if ((uVar24 & 0x40) != 0) {
        *(long *)vto[lVar21].data.str = (long)iVar23;
        goto switchD_00102d33_caseD_5;
      }
      if ((uVar24 & 0x20) == 0) {
        if ((uVar24 & 0x10) == 0) {
          *(int *)vto[lVar21].data.str = iVar23;
        }
        else {
          *(short *)vto[lVar21].data.str = (short)iVar23;
        }
      }
      else {
        *(long *)vto[lVar21].data.str = (long)iVar23;
      }
      break;
    default:
switchD_00102d33_caseD_5:
      break;
    case FORMAT_DOUBLE:
      formatbuf[0x10] = '\0';
      formatbuf[0x11] = '\0';
      formatbuf[0x12] = '\0';
      formatbuf[0x13] = '\0';
      formatbuf[0x14] = '\0';
      formatbuf[0x15] = '\0';
      formatbuf[0x16] = '\0';
      formatbuf[0x17] = '\0';
      formatbuf[0x18] = '\0';
      formatbuf[0x19] = '\0';
      formatbuf[0x1a] = '\0';
      formatbuf[0x1b] = '\0';
      formatbuf[0x1c] = '\0';
      formatbuf[0x1d] = '\0';
      formatbuf[0x1e] = '\0';
      formatbuf[0x1f] = '\0';
      formatbuf[0] = '%';
      formatbuf[1] = '\0';
      formatbuf[2] = '\0';
      formatbuf[3] = '\0';
      formatbuf[4] = '\0';
      formatbuf[5] = '\0';
      formatbuf[6] = '\0';
      formatbuf[7] = '\0';
      formatbuf[8] = '\0';
      formatbuf[9] = '\0';
      formatbuf[10] = '\0';
      formatbuf[0xb] = '\0';
      formatbuf[0xc] = '\0';
      formatbuf[0xd] = '\0';
      formatbuf[0xe] = '\0';
      formatbuf[0xf] = '\0';
      sVar8 = strlen(formatbuf);
      pcVar7 = pcVar22;
      if (((uVar25 >> 0xd & 1) == 0) &&
         (pcVar7 = (char *)0xffffffffffffffff, (uVar25 >> 0xe & 1) != 0)) {
        pcVar7 = vto[(long)pcVar22].data.str;
      }
      buffer = (byte *)(formatbuf + 1);
      if ((short)uVar24 < 0) {
        paVar11 = (anon_union_8_4_dbbb708a_for_data *)&vto[lVar21].precision;
LAB_00102f2b:
        pcVar22 = paVar11->str;
      }
      else {
        pcVar22 = (char *)0xffffffffffffffff;
        if ((uVar25 >> 0x10 & 1) != 0) {
          paVar11 = &vto[vto[lVar21].precision].data;
          goto LAB_00102f2b;
        }
      }
      if ((uVar24 & 4) != 0) {
        formatbuf[1] = '-';
        buffer = (byte *)(formatbuf + 2);
      }
      if ((uVar24 & 2) != 0) {
        *buffer = 0x2b;
        buffer = buffer + 1;
      }
      if ((uVar24 & 1) != 0) {
        *buffer = 0x20;
        buffer = buffer + 1;
        uVar24 = (ulong)(uint)vto[lVar21].flags;
      }
      if ((uVar24 & 8) != 0) {
        *buffer = 0x23;
        buffer = buffer + 1;
      }
      maxlength = 0x20 - sVar8;
      *buffer = 0;
      if (-1 < (long)pcVar7) {
        if ((char *)0x144 < pcVar7) {
          pcVar7 = (char *)0x145;
        }
        iVar3 = curl_msnprintf((char *)buffer,maxlength,"%ld",pcVar7);
        buffer = buffer + iVar3;
        maxlength = maxlength - (long)iVar3;
      }
      if (-1 < (long)pcVar22) {
        lVar5 = 0x144;
        for (dVar1 = vto[lVar21].data.dnum; 10.0 <= dVar1; dVar1 = dVar1 / 10.0) {
          lVar5 = lVar5 + -1;
        }
        pcVar7 = (char *)(lVar5 + -1);
        if ((long)pcVar22 <= lVar5) {
          pcVar7 = pcVar22;
        }
        iVar3 = curl_msnprintf((char *)buffer,maxlength,".%ld",pcVar7);
        buffer = buffer + iVar3;
      }
      uVar25 = vto[lVar21].flags;
      if ((uVar25 & 0x20) != 0) {
        *buffer = 0x6c;
        buffer = buffer + 1;
        uVar25 = vto[lVar21].flags;
      }
      if ((uVar25 >> 0x12 & 1) == 0) {
        bVar20 = 0x66;
        if ((uVar25 >> 0x13 & 1) != 0) {
          bVar20 = ((uVar25 >> 0xc & 1) == 0) << 5 | 0x47;
        }
      }
      else {
        bVar20 = ((uVar25 >> 0xc & 1) == 0) << 5 | 0x45;
      }
      *buffer = bVar20;
      buffer[1] = 0;
      pcVar7 = work;
      sprintf(pcVar7,formatbuf,SUB84(vto[lVar21].data,0));
      for (; *pcVar7 != '\0'; pcVar7 = pcVar7 + 1) {
        iVar3 = (*stream)((int)*pcVar7,(FILE *)data);
        if (iVar3 == -1) {
          return iVar23;
        }
        iVar23 = iVar23 + 1;
      }
    }
    format = *ppcVar12;
    ppcVar12 = ppcVar12 + 1;
    pcVar7 = format;
  } while( true );
LAB_00102750:
  if (lVar21 - 0x81U < 0xffffffffffffff80) {
    return -1;
  }
  lVar21 = lVar21 + -1;
  switch(bVar20) {
  case 99:
    vto[lVar21].type = FORMAT_INT;
    uVar25 = uVar25 | 0x20000;
    break;
  case 100:
  case 0x69:
    vto[lVar21].type = FORMAT_INT;
    break;
  case 0x65:
    vto[lVar21].type = FORMAT_DOUBLE;
    uVar25 = uVar25 | 0x40000;
    break;
  case 0x66:
    vto[lVar21].type = FORMAT_DOUBLE;
    break;
  case 0x67:
    vto[lVar21].type = FORMAT_DOUBLE;
    uVar25 = uVar25 | 0x80000;
    break;
  case 0x6e:
    vto[lVar21].type = FORMAT_INTPTR;
    break;
  case 0x6f:
    vto[lVar21].type = FORMAT_INT;
    uVar25 = uVar25 | 0x400;
    break;
  case 0x70:
    vto[lVar21].type = FORMAT_PTR;
    break;
  case 0x73:
switchD_00102792_caseD_73:
    vto[lVar21].type = FORMAT_STRING;
    break;
  case 0x75:
    vto[lVar21].type = FORMAT_INT;
    uVar25 = uVar25 | 0x200;
    break;
  case 0x78:
    vto[lVar21].type = FORMAT_INT;
    uVar25 = uVar25 | 0xa00;
    break;
  default:
    if (bVar20 == 0x45) {
      vto[lVar21].type = FORMAT_DOUBLE;
      uVar25 = uVar25 | 0x41000;
      break;
    }
    if (bVar20 == 0x47) {
      vto[lVar21].type = FORMAT_DOUBLE;
      uVar25 = uVar25 | 0x81000;
      break;
    }
    if (bVar20 == 0x58) {
      vto[lVar21].type = FORMAT_INT;
      uVar25 = uVar25 | 0x1a00;
      break;
    }
    if (bVar20 == 0x53) {
      uVar25 = uVar25 | 8;
      goto switchD_00102792_caseD_73;
    }
  case 0x68:
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x6d:
  case 0x71:
  case 0x72:
  case 0x74:
  case 0x76:
  case 0x77:
    vto[lVar21].type = FORMAT_UNKNOWN;
  }
  vto[lVar21].flags = uVar25;
  vto[lVar21].width = lVar5;
  vto[lVar21].precision = local_1600;
  if ((uVar25 >> 0xe & 1) != 0) {
    lVar5 = lVar5 + -1;
    vto[lVar21].width = lVar5;
    vto[lVar5].type = FORMAT_WIDTH;
    *(undefined8 *)&vto[lVar5].flags = 0;
    *(undefined8 *)((long)&vto[lVar5].width + 4) = 0;
    *(undefined4 *)((long)&vto[lVar5].precision + 4) = 0;
  }
  if ((uVar25 >> 0x10 & 1) != 0) {
    local_1600 = local_1600 + -1;
    vto[lVar21].precision = local_1600;
    vto[local_1600].type = FORMAT_WIDTH;
    *(undefined8 *)&vto[local_1600].flags = 0;
    *(undefined8 *)((long)&vto[local_1600].width + 4) = 0;
    *(undefined4 *)((long)&vto[local_1600].precision + 4) = 0;
  }
  *local_15c0 = (char *)(work._0_8_ + 1);
  ppcVar12 = local_15c0 + 1;
  goto LAB_001024ea;
}

Assistant:

static int dprintf_formatf(
  void *data, /* untouched by format(), just sent to the stream() function in
                 the second argument */
  /* function pointer called for each output character */
  int (*stream)(int, FILE *),
  const char *format,    /* %-formatted string */
  va_list ap_save) /* list of parameters */
{
  /* Base-36 digits for numbers.  */
  const char *digits = lower_digits;

  /* Pointer into the format string.  */
  char *f;

  /* Number of characters written.  */
  int done = 0;

  long param; /* current parameter to read */
  long param_num = 0; /* parameter counter */

  va_stack_t vto[MAX_PARAMETERS];
  char *endpos[MAX_PARAMETERS];
  char **end;

  char work[BUFFSIZE];

  va_stack_t *p;

  /* 'workend' points to the final buffer byte position, but with an extra
     byte as margin to avoid the (false?) warning Coverity gives us
     otherwise */
  char *workend = &work[sizeof(work) - 2];

  /* Do the actual %-code parsing */
  if(dprintf_Pass1(format, vto, endpos, ap_save))
    return -1;

  end = &endpos[0]; /* the initial end-position from the list dprintf_Pass1()
                       created for us */

  f = (char *)format;
  while(*f != '\0') {
    /* Format spec modifiers.  */
    int is_alt;

    /* Width of a field.  */
    long width;

    /* Precision of a field.  */
    long prec;

    /* Decimal integer is negative.  */
    int is_neg;

    /* Base of a number to be written.  */
    unsigned long base;

    /* Integral values to be written.  */
    mp_uintmax_t num;

    /* Used to convert negative in positive.  */
    mp_intmax_t signed_num;

    char *w;

    if(*f != '%') {
      /* This isn't a format spec, so write everything out until the next one
         OR end of string is reached.  */
      do {
        OUTCHAR(*f);
      } while(*++f && ('%' != *f));
      continue;
    }

    ++f;

    /* Check for "%%".  Note that although the ANSI standard lists
       '%' as a conversion specifier, it says "The complete format
       specification shall be `%%'," so we can avoid all the width
       and precision processing.  */
    if(*f == '%') {
      ++f;
      OUTCHAR('%');
      continue;
    }

    /* If this is a positional parameter, the position must follow immediately
       after the %, thus create a %<num>$ sequence */
    param = dprintf_DollarString(f, &f);

    if(!param)
      param = param_num;
    else
      --param;

    param_num++; /* increase this always to allow "%2$s %1$s %s" and then the
                    third %s will pick the 3rd argument */

    p = &vto[param];

    /* pick up the specified width */
    if(p->flags & FLAGS_WIDTHPARAM) {
      width = (long)vto[p->width].data.num.as_signed;
      param_num++; /* since the width is extracted from a parameter, we
                      must skip that to get to the next one properly */
      if(width < 0) {
        /* "A negative field width is taken as a '-' flag followed by a
           positive field width." */
        width = -width;
        p->flags |= FLAGS_LEFT;
        p->flags &= ~FLAGS_PAD_NIL;
      }
    }
    else
      width = p->width;

    /* pick up the specified precision */
    if(p->flags & FLAGS_PRECPARAM) {
      prec = (long)vto[p->precision].data.num.as_signed;
      param_num++; /* since the precision is extracted from a parameter, we
                      must skip that to get to the next one properly */
      if(prec < 0)
        /* "A negative precision is taken as if the precision were
           omitted." */
        prec = -1;
    }
    else if(p->flags & FLAGS_PREC)
      prec = p->precision;
    else
      prec = -1;

    is_alt = (p->flags & FLAGS_ALT) ? 1 : 0;

    switch(p->type) {
    case FORMAT_INT:
      num = p->data.num.as_unsigned;
      if(p->flags & FLAGS_CHAR) {
        /* Character.  */
        if(!(p->flags & FLAGS_LEFT))
          while(--width > 0)
            OUTCHAR(' ');
        OUTCHAR((char) num);
        if(p->flags & FLAGS_LEFT)
          while(--width > 0)
            OUTCHAR(' ');
        break;
      }
      if(p->flags & FLAGS_OCTAL) {
        /* Octal unsigned integer.  */
        base = 8;
        goto unsigned_number;
      }
      else if(p->flags & FLAGS_HEX) {
        /* Hexadecimal unsigned integer.  */

        digits = (p->flags & FLAGS_UPPER)? upper_digits : lower_digits;
        base = 16;
        goto unsigned_number;
      }
      else if(p->flags & FLAGS_UNSIGNED) {
        /* Decimal unsigned integer.  */
        base = 10;
        goto unsigned_number;
      }

      /* Decimal integer.  */
      base = 10;

      is_neg = (p->data.num.as_signed < (mp_intmax_t)0) ? 1 : 0;
      if(is_neg) {
        /* signed_num might fail to hold absolute negative minimum by 1 */
        signed_num = p->data.num.as_signed + (mp_intmax_t)1;
        signed_num = -signed_num;
        num = (mp_uintmax_t)signed_num;
        num += (mp_uintmax_t)1;
      }

      goto number;

      unsigned_number:
      /* Unsigned number of base BASE.  */
      is_neg = 0;

      number:
      /* Number of base BASE.  */

      /* Supply a default precision if none was given.  */
      if(prec == -1)
        prec = 1;

      /* Put the number in WORK.  */
      w = workend;
      while(num > 0) {
        *w-- = digits[num % base];
        num /= base;
      }
      width -= (long)(workend - w);
      prec -= (long)(workend - w);

      if(is_alt && base == 8 && prec <= 0) {
        *w-- = '0';
        --width;
      }

      if(prec > 0) {
        width -= prec;
        while(prec-- > 0)
          *w-- = '0';
      }

      if(is_alt && base == 16)
        width -= 2;

      if(is_neg || (p->flags & FLAGS_SHOWSIGN) || (p->flags & FLAGS_SPACE))
        --width;

      if(!(p->flags & FLAGS_LEFT) && !(p->flags & FLAGS_PAD_NIL))
        while(width-- > 0)
          OUTCHAR(' ');

      if(is_neg)
        OUTCHAR('-');
      else if(p->flags & FLAGS_SHOWSIGN)
        OUTCHAR('+');
      else if(p->flags & FLAGS_SPACE)
        OUTCHAR(' ');

      if(is_alt && base == 16) {
        OUTCHAR('0');
        if(p->flags & FLAGS_UPPER)
          OUTCHAR('X');
        else
          OUTCHAR('x');
      }

      if(!(p->flags & FLAGS_LEFT) && (p->flags & FLAGS_PAD_NIL))
        while(width-- > 0)
          OUTCHAR('0');

      /* Write the number.  */
      while(++w <= workend) {
        OUTCHAR(*w);
      }

      if(p->flags & FLAGS_LEFT)
        while(width-- > 0)
          OUTCHAR(' ');
      break;

    case FORMAT_STRING:
            /* String.  */
      {
        static const char null[] = "(nil)";
        const char *str;
        size_t len;

        str = (char *) p->data.str;
        if(str == NULL) {
          /* Write null[] if there's space.  */
          if(prec == -1 || prec >= (long) sizeof(null) - 1) {
            str = null;
            len = sizeof(null) - 1;
            /* Disable quotes around (nil) */
            p->flags &= (~FLAGS_ALT);
          }
          else {
            str = "";
            len = 0;
          }
        }
        else if(prec != -1)
          len = (size_t)prec;
        else
          len = strlen(str);

        width -= (len > LONG_MAX) ? LONG_MAX : (long)len;

        if(p->flags & FLAGS_ALT)
          OUTCHAR('"');

        if(!(p->flags&FLAGS_LEFT))
          while(width-- > 0)
            OUTCHAR(' ');

        for(; len && *str; len--)
          OUTCHAR(*str++);
        if(p->flags&FLAGS_LEFT)
          while(width-- > 0)
            OUTCHAR(' ');

        if(p->flags & FLAGS_ALT)
          OUTCHAR('"');
      }
      break;

    case FORMAT_PTR:
      /* Generic pointer.  */
      {
        void *ptr;
        ptr = (void *) p->data.ptr;
        if(ptr != NULL) {
          /* If the pointer is not NULL, write it as a %#x spec.  */
          base = 16;
          digits = (p->flags & FLAGS_UPPER)? upper_digits : lower_digits;
          is_alt = 1;
          num = (size_t) ptr;
          is_neg = 0;
          goto number;
        }
        else {
          /* Write "(nil)" for a nil pointer.  */
          static const char strnil[] = "(nil)";
          const char *point;

          width -= (long)(sizeof(strnil) - 1);
          if(p->flags & FLAGS_LEFT)
            while(width-- > 0)
              OUTCHAR(' ');
          for(point = strnil; *point != '\0'; ++point)
            OUTCHAR(*point);
          if(! (p->flags & FLAGS_LEFT))
            while(width-- > 0)
              OUTCHAR(' ');
        }
      }
      break;

    case FORMAT_DOUBLE:
      {
        char formatbuf[32]="%";
        char *fptr = &formatbuf[1];
        size_t left = sizeof(formatbuf)-strlen(formatbuf);
        int len;

        width = -1;
        if(p->flags & FLAGS_WIDTH)
          width = p->width;
        else if(p->flags & FLAGS_WIDTHPARAM)
          width = (long)vto[p->width].data.num.as_signed;

        prec = -1;
        if(p->flags & FLAGS_PREC)
          prec = p->precision;
        else if(p->flags & FLAGS_PRECPARAM)
          prec = (long)vto[p->precision].data.num.as_signed;

        if(p->flags & FLAGS_LEFT)
          *fptr++ = '-';
        if(p->flags & FLAGS_SHOWSIGN)
          *fptr++ = '+';
        if(p->flags & FLAGS_SPACE)
          *fptr++ = ' ';
        if(p->flags & FLAGS_ALT)
          *fptr++ = '#';

        *fptr = 0;

        if(width >= 0) {
          if(width >= (long)sizeof(work))
            width = sizeof(work)-1;
          /* RECURSIVE USAGE */
          len = curl_msnprintf(fptr, left, "%ld", width);
          fptr += len;
          left -= len;
        }
        if(prec >= 0) {
          /* for each digit in the integer part, we can have one less
             precision */
          size_t maxprec = sizeof(work) - 2;
          double val = p->data.dnum;
          while(val >= 10.0) {
            val /= 10;
            maxprec--;
          }

          if(prec > (long)maxprec)
            prec = (long)maxprec-1;
          /* RECURSIVE USAGE */
          len = curl_msnprintf(fptr, left, ".%ld", prec);
          fptr += len;
        }
        if(p->flags & FLAGS_LONG)
          *fptr++ = 'l';

        if(p->flags & FLAGS_FLOATE)
          *fptr++ = (char)((p->flags & FLAGS_UPPER) ? 'E':'e');
        else if(p->flags & FLAGS_FLOATG)
          *fptr++ = (char)((p->flags & FLAGS_UPPER) ? 'G' : 'g');
        else
          *fptr++ = 'f';

        *fptr = 0; /* and a final zero termination */

        /* NOTE NOTE NOTE!! Not all sprintf implementations return number of
           output characters */
        (sprintf)(work, formatbuf, p->data.dnum);
        DEBUGASSERT(strlen(work) <= sizeof(work));
        for(fptr = work; *fptr; fptr++)
          OUTCHAR(*fptr);
      }
      break;

    case FORMAT_INTPTR:
      /* Answer the count of characters written.  */
#ifdef HAVE_LONG_LONG_TYPE
      if(p->flags & FLAGS_LONGLONG)
        *(LONG_LONG_TYPE *) p->data.ptr = (LONG_LONG_TYPE)done;
      else
#endif
        if(p->flags & FLAGS_LONG)
          *(long *) p->data.ptr = (long)done;
      else if(!(p->flags & FLAGS_SHORT))
        *(int *) p->data.ptr = (int)done;
      else
        *(short *) p->data.ptr = (short)done;
      break;

    default:
      break;
    }
    f = *end++; /* goto end of %-code */

  }
  return done;
}